

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::CompactReporter::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  Colour colour;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    std::operator<<(this->stream,";");
    colour.m_moved = false;
    Colour::use(FileName);
    std::operator<<(this->stream," expression was:");
    Colour::~Colour(&colour);
    printOriginalExpression(this);
    return;
  }
  return;
}

Assistant:

void printExpressionWas() {
                if( result.hasExpression() ) {
                    stream << ";";
                    {
                        Colour colour( dimColour() );
                        stream << " expression was:";
                    }
                    printOriginalExpression();
                }
            }